

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void abort_write_jobs(cio_websocket *websocket)

{
  cio_websocket_write_job *pcVar1;
  cio_websocket_write_job *pcVar2;
  cio_websocket_write_job *pcVar3;
  
  pcVar2 = (websocket->ws_private).first_write_job;
  if (pcVar2 != (cio_websocket_write_job *)0x0) {
    if (pcVar2 != (websocket->ws_private).last_write_job) goto LAB_00105318;
    pcVar1 = (cio_websocket_write_job *)0x0;
    pcVar3 = pcVar2;
    while( true ) {
      pcVar2 = pcVar1;
      (websocket->ws_private).first_write_job = pcVar2;
      pcVar3->wbh = (cio_write_buffer *)0x0;
      if (pcVar3->handler != (cio_websocket_write_handler_t)0x0) {
        (*pcVar3->handler)(websocket,pcVar3->handler_context,CIO_OPERATION_ABORTED);
        pcVar2 = (websocket->ws_private).first_write_job;
      }
      if (pcVar2 == (cio_websocket_write_job *)0x0) break;
      pcVar1 = (cio_websocket_write_job *)0x0;
      pcVar3 = pcVar2;
      if (pcVar2 != (websocket->ws_private).last_write_job) {
LAB_00105318:
        pcVar1 = pcVar2->next;
        pcVar3 = pcVar2;
      }
    }
  }
  return;
}

Assistant:

static struct cio_websocket_write_job *dequeue_job(struct cio_websocket *websocket)
{
	struct cio_websocket_write_job *job = websocket->ws_private.first_write_job;
	if (job == NULL) {
		return NULL;
	}

	if (websocket->ws_private.first_write_job == websocket->ws_private.last_write_job) {
		websocket->ws_private.first_write_job = NULL;
	} else {
		websocket->ws_private.first_write_job = job->next;
	}

	return job;
}